

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_list.cpp
# Opt level: O0

void __thiscall libtorrent::aux::tracker_list::stop_announcing(tracker_list *this,time_point32 now)

{
  bool bVar1;
  reference paVar2;
  reference paVar3;
  iterator pvVar4;
  value_type *a;
  iterator __end4;
  iterator __begin4;
  array<announce_infohash,_num_protocols,_protocol_version>_conflict *__range4;
  announce_endpoint *aep;
  iterator __end3;
  iterator __begin3;
  vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
  *__range3;
  announce_entry *t;
  iterator __end2;
  iterator __begin2;
  trackers_t *__range2;
  tracker_list *this_local;
  time_point32 now_local;
  
  boost::intrusive::
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
  ::begin((list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
           *)&__end2);
  boost::intrusive::
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
  ::end((list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
         *)&t);
  while( true ) {
    bVar1 = boost::intrusive::operator!=
                      (&__end2,(list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                                *)&t);
    if (!bVar1) break;
    paVar2 = boost::intrusive::
             list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
             ::operator*(&__end2);
    __end3 = ::std::
             vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
             ::begin(&paVar2->endpoints);
    aep = (announce_endpoint *)
          ::std::
          vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
          ::end(&paVar2->endpoints);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
                                  *)&aep);
      if (!bVar1) break;
      paVar3 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
               ::operator*(&__end3);
      __end4 = ::std::array<libtorrent::aux::announce_infohash,_2UL>::begin
                         (&(paVar3->info_hashes).
                           super_array<libtorrent::aux::announce_infohash,_2UL>);
      pvVar4 = ::std::array<libtorrent::aux::announce_infohash,_2UL>::end
                         (&(paVar3->info_hashes).
                           super_array<libtorrent::aux::announce_infohash,_2UL>);
      for (; __end4 != pvVar4; __end4 = __end4 + 1) {
        (__end4->next_announce).__d.__r = (rep_conflict)now.__d.__r;
        (__end4->min_announce).__d.__r = (rep_conflict)now.__d.__r;
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
      ::operator++(&__end3);
    }
    boost::intrusive::
    list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void tracker_list::stop_announcing(time_point32 const now)
{
	INVARIANT_CHECK;

	for (auto& t : m_trackers)
	{
		for (auto& aep : t.endpoints)
		{
			for (auto& a : aep.info_hashes)
			{
				a.next_announce = now;
				a.min_announce = now;
			}
		}
	}
}